

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btVector3 *pivotInA,
          btVector3 *pivotInB,btVector3 *axisInA,btVector3 *axisInB,bool useReferenceFrameA)

{
  undefined8 uVar1;
  btVector3 *pbVar2;
  btTransform *pbVar3;
  btScalar *pbVar4;
  btScalar *pbVar5;
  btVector3 *this_00;
  btScalar *yx;
  btScalar *xz;
  btScalar *xy;
  undefined8 *in_RCX;
  btRigidBody *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  btVector3 *in_R9;
  btVector3 bVar6;
  btQuaternion bVar7;
  btVector3 *in_stack_00000008;
  byte in_stack_00000010;
  btVector3 rbAxisB2;
  btVector3 rbAxisB1;
  btQuaternion rotationArc;
  btScalar projection;
  btVector3 rbAxisA2;
  btVector3 rbAxisA1;
  btRigidBody *in_stack_fffffffffffffbf8;
  btRigidBody *in_stack_fffffffffffffc00;
  btVector3 *in_stack_fffffffffffffc08;
  int iVar8;
  btTypedConstraint *in_stack_fffffffffffffc10;
  btScalar *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 uVar9;
  btVector3 *in_stack_fffffffffffffc28;
  btQuaternion *in_stack_fffffffffffffc30;
  btScalar *in_stack_fffffffffffffc38;
  btScalar *in_stack_fffffffffffffc40;
  btScalar *in_stack_fffffffffffffc48;
  btVector3 *in_stack_fffffffffffffc58;
  btVector3 *in_stack_fffffffffffffc60;
  btScalar local_348;
  btScalar bStack_344;
  btScalar local_328;
  btScalar bStack_324;
  btScalar local_2b8;
  btScalar bStack_2b4;
  btScalar local_298;
  btScalar bStack_294;
  btScalar local_278;
  btScalar bStack_274;
  btScalar local_248;
  btScalar bStack_244;
  btScalar local_218;
  btScalar bStack_214;
  btScalar local_1e8;
  btScalar bStack_1e4;
  btScalar local_1c8;
  btScalar bStack_1c4;
  undefined8 *local_148;
  undefined8 *local_128;
  btVector3 local_11c;
  btVector3 local_10c;
  btScalar local_fc;
  btScalar bStack_f8;
  undefined8 local_f4;
  btScalar local_ec;
  btScalar bStack_e8;
  btScalar local_e4 [2];
  btScalar local_dc;
  btScalar bStack_d8;
  btScalar abStack_d4 [2];
  btScalar local_cc;
  btScalar bStack_c8;
  btScalar local_c4 [2];
  btScalar local_bc;
  btScalar bStack_b8;
  btScalar abStack_b4 [2];
  btScalar local_ac;
  btScalar bStack_a8;
  btScalar local_a4 [2];
  btScalar local_9c;
  btScalar bStack_98;
  undefined8 local_94;
  btScalar local_8c;
  btScalar bStack_88;
  btScalar abStack_84 [2];
  btScalar local_7c;
  btVector3 local_78;
  btVector3 local_68 [2];
  byte local_41;
  btVector3 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  btRigidBody *local_20;
  
  local_41 = in_stack_00000010 & 1;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_20 = in_RSI;
  btTypedConstraint::btTypedConstraint
            (in_stack_fffffffffffffc10,
             (btTypedConstraintType)((ulong)in_stack_fffffffffffffc08 >> 0x20),
             in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *in_RDI = &PTR__btHingeConstraint_002e72c0;
  local_128 = in_RDI + 9;
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_fffffffffffffc00);
    local_128 = (undefined8 *)((long)local_128 + 0x54);
  } while (local_128 != (undefined8 *)((long)in_RDI + 0x144));
  local_148 = (undefined8 *)((long)in_RDI + 0x144);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_fffffffffffffc00);
    local_148 = (undefined8 *)((long)local_148 + 0x54);
  } while (local_148 != in_RDI + 0x48);
  btTransform::btTransform((btTransform *)in_stack_fffffffffffffc00);
  btTransform::btTransform((btTransform *)in_stack_fffffffffffffc00);
  btAngularLimit::btAngularLimit((btAngularLimit *)(in_RDI + 0x59));
  *(undefined1 *)(in_RDI + 0x5f) = 0;
  *(undefined1 *)((long)in_RDI + 0x2f9) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fa) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fb) = 1;
  *(byte *)((long)in_RDI + 0x2fc) = local_41 & 1;
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 0x30c) = 0;
  *(undefined4 *)(in_RDI + 0x62) = 0;
  *(undefined4 *)((long)in_RDI + 0x314) = 0;
  pbVar2 = btTransform::getOrigin((btTransform *)(in_RDI + 0x48));
  uVar1 = local_30[1];
  *(undefined8 *)pbVar2->m_floats = *local_30;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar1;
  pbVar3 = btRigidBody::getCenterOfMassTransform(local_20);
  btTransform::getBasis(pbVar3);
  bVar6 = btMatrix3x3::getColumn
                    ((btMatrix3x3 *)in_stack_fffffffffffffc10,
                     (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  local_68[0].m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_68[0].m_floats._0_8_ = bVar6.m_floats._0_8_;
  btVector3::btVector3(&local_78);
  local_7c = btVector3::dot(local_40,local_68);
  if (local_7c < 0.9999999) {
    if (-0.9999999 < local_7c) {
      bVar6 = btVector3::cross((btVector3 *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      abStack_d4 = bVar6.m_floats._8_8_;
      local_78.m_floats._0_8_ = bVar6.m_floats._0_8_;
      local_298 = bVar6.m_floats[0];
      bStack_294 = bVar6.m_floats[1];
      local_dc = local_298;
      bStack_d8 = bStack_294;
      local_78.m_floats._8_8_ = abStack_d4;
      bVar6 = btVector3::cross((btVector3 *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      local_e4 = bVar6.m_floats._8_8_;
      local_68[0].m_floats._0_8_ = bVar6.m_floats._0_8_;
      local_2b8 = bVar6.m_floats[0];
      bStack_2b4 = bVar6.m_floats[1];
      local_ec = local_2b8;
      bStack_e8 = bStack_2b4;
      local_68[0].m_floats._8_8_ = local_e4;
    }
    else {
      pbVar3 = btRigidBody::getCenterOfMassTransform(local_20);
      iVar8 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
      btTransform::getBasis(pbVar3);
      bVar6 = btMatrix3x3::getColumn((btMatrix3x3 *)in_stack_fffffffffffffc10,iVar8);
      abStack_b4 = bVar6.m_floats._8_8_;
      local_68[0].m_floats._0_8_ = bVar6.m_floats._0_8_;
      local_248 = bVar6.m_floats[0];
      bStack_244 = bVar6.m_floats[1];
      local_bc = local_248;
      bStack_b8 = bStack_244;
      local_68[0].m_floats._8_8_ = abStack_b4;
      pbVar3 = btRigidBody::getCenterOfMassTransform(local_20);
      btTransform::getBasis(pbVar3);
      bVar6 = btMatrix3x3::getColumn((btMatrix3x3 *)in_stack_fffffffffffffc10,iVar8);
      local_c4 = bVar6.m_floats._8_8_;
      local_78.m_floats._0_8_ = bVar6.m_floats._0_8_;
      local_278 = bVar6.m_floats[0];
      bStack_274 = bVar6.m_floats[1];
      local_cc = local_278;
      bStack_c8 = bStack_274;
      local_78.m_floats._8_8_ = local_c4;
    }
  }
  else {
    pbVar3 = btRigidBody::getCenterOfMassTransform(local_20);
    iVar8 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
    btTransform::getBasis(pbVar3);
    bVar6 = btMatrix3x3::getColumn((btMatrix3x3 *)in_stack_fffffffffffffc10,iVar8);
    local_94 = bVar6.m_floats._8_8_;
    local_1c8 = bVar6.m_floats[0];
    bStack_1c4 = bVar6.m_floats[1];
    local_9c = local_1c8;
    bStack_98 = bStack_1c4;
    bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc00);
    abStack_84 = bVar6.m_floats._8_8_;
    local_68[0].m_floats._0_8_ = bVar6.m_floats._0_8_;
    local_1e8 = bVar6.m_floats[0];
    bStack_1e4 = bVar6.m_floats[1];
    local_8c = local_1e8;
    bStack_88 = bStack_1e4;
    local_68[0].m_floats._8_8_ = abStack_84;
    pbVar3 = btRigidBody::getCenterOfMassTransform(local_20);
    btTransform::getBasis(pbVar3);
    bVar6 = btMatrix3x3::getColumn((btMatrix3x3 *)in_stack_fffffffffffffc10,iVar8);
    local_a4 = bVar6.m_floats._8_8_;
    local_78.m_floats._0_8_ = bVar6.m_floats._0_8_;
    local_218 = bVar6.m_floats[0];
    bStack_214 = bVar6.m_floats[1];
    local_ac = local_218;
    bStack_a8 = bStack_214;
    local_78.m_floats._8_8_ = local_a4;
  }
  btTransform::getBasis((btTransform *)(in_RDI + 0x48));
  btVector3::getX(local_68);
  btVector3::getX(&local_78);
  btVector3::getX(local_40);
  btVector3::getY(local_68);
  btVector3::getY(&local_78);
  pbVar4 = btVector3::getY(local_40);
  pbVar5 = btVector3::getZ(local_68);
  pbVar2 = (btVector3 *)btVector3::getZ(&local_78);
  this_00 = (btVector3 *)btVector3::getZ(local_40);
  btMatrix3x3::setValue
            ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18,(btScalar *)this_00,(btScalar *)pbVar2,pbVar5,pbVar4,
             (btScalar *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc48);
  bVar7 = shortestArcQuat(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  local_f4 = bVar7.super_btQuadWord.m_floats._8_8_;
  local_328 = bVar7.super_btQuadWord.m_floats[0];
  bStack_324 = bVar7.super_btQuadWord.m_floats[1];
  local_fc = local_328;
  bStack_f8 = bStack_324;
  bVar6 = quatRotate(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  local_10c.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_348 = bVar6.m_floats[0];
  bStack_344 = bVar6.m_floats[1];
  local_10c.m_floats[0] = local_348;
  local_10c.m_floats[1] = bStack_344;
  bVar6 = btVector3::cross(this_00,pbVar2);
  local_11c.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_11c.m_floats._0_8_ = bVar6.m_floats._0_8_;
  pbVar2 = btTransform::getOrigin((btTransform *)(in_RDI + 0x50));
  uVar1 = local_38[1];
  *(undefined8 *)pbVar2->m_floats = *local_38;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar1;
  btTransform::getBasis((btTransform *)(in_RDI + 0x50));
  btVector3::getX(&local_10c);
  btVector3::getX(&local_11c);
  btVector3::getX(in_stack_00000008);
  btVector3::getY(&local_10c);
  pbVar4 = btVector3::getY(&local_11c);
  pbVar5 = btVector3::getY(in_stack_00000008);
  yx = btVector3::getZ(&local_10c);
  xz = btVector3::getZ(&local_11c);
  xy = btVector3::getZ(in_stack_00000008);
  btMatrix3x3::setValue
            ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18,xy,xz,yx,pbVar5,xz,yx,pbVar5,pbVar4);
  uVar9 = 0xbf800000;
  if ((*(byte *)((long)in_RDI + 0x2fc) & 1) == 0) {
    uVar9 = 0x3f800000;
  }
  *(undefined4 *)((long)in_RDI + 0x2f4) = uVar9;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,btRigidBody& rbB, const btVector3& pivotInA,const btVector3& pivotInB,
									 const btVector3& axisInA,const btVector3& axisInB, bool useReferenceFrameA)
									 :btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA,rbB),
#ifdef _BT_USE_CENTER_LIMIT_
									 m_limit(),
#endif
									 m_angularOnly(false),
									 m_enableAngularMotor(false),
									 m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
									 m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
									 m_useReferenceFrameA(useReferenceFrameA),
									 m_flags(0),
									 m_normalCFM(0),
									 m_normalERP(0),
									 m_stopCFM(0),
									 m_stopERP(0)
{
	m_rbAFrame.getOrigin() = pivotInA;
	
	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	btVector3 rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(0);

	btVector3 rbAxisA2;
	btScalar projection = axisInA.dot(rbAxisA1);
	if (projection >= 1.0f - SIMD_EPSILON) {
		rbAxisA1 = -rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);
	} else if (projection <= -1.0f + SIMD_EPSILON) {
		rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);      
	} else {
		rbAxisA2 = axisInA.cross(rbAxisA1);
		rbAxisA1 = rbAxisA2.cross(axisInA);
	}

	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 =  axisInB.cross(rbAxisB1);	
	
	m_rbBFrame.getOrigin() = pivotInB;
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}